

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stdio_transporter.cpp
# Opt level: O1

string * __thiscall
lscpp::stdio_transporter::read_line_abi_cxx11_
          (string *__return_storage_ptr__,stdio_transporter *this)

{
  char cVar1;
  size_t size;
  
  cVar1 = read_char(this);
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  __return_storage_ptr__->_M_string_length = 0;
  (__return_storage_ptr__->field_2)._M_local_buf[0] = '\0';
  if (cVar1 != '\r') {
    size = 0;
    do {
      reserve(this,size);
      (this->data_)._M_t.super___uniq_ptr_impl<char,_std::default_delete<char[]>_>._M_t.
      super__Tuple_impl<0UL,_char_*,_std::default_delete<char[]>_>.
      super__Head_base<0UL,_char_*,_false>._M_head_impl[size] = cVar1;
      cVar1 = read_char(this);
      size = size + 1;
    } while (cVar1 != '\r');
  }
  cVar1 = read_char(this);
  if (cVar1 == '\n') {
    std::__cxx11::string::append
              ((char *)__return_storage_ptr__,
               (ulong)(this->data_)._M_t.super___uniq_ptr_impl<char,_std::default_delete<char[]>_>.
                      _M_t.super__Tuple_impl<0UL,_char_*,_std::default_delete<char[]>_>.
                      super__Head_base<0UL,_char_*,_false>._M_head_impl);
  }
  return __return_storage_ptr__;
}

Assistant:

std::string stdio_transporter::read_line() {
  char c = read_char();
  std::size_t pos = 0;
  std::string line;
#ifdef _WIN32
  while (c != char_lf) {
    reserve(pos);
    data_.get()[pos] = c;
    pos++;
    c = read_char();
  }
  line.append(data_.get(), pos);
#else
  while (c != char_cr) {
    reserve(pos);
    data_.get()[pos] = c;
    pos++;
    c = read_char();
  }
  c = read_char();
  if (c == char_lf) {
    line.append(data_.get(), pos);
  } else {
    // TODO error
  }
#endif
  return line;
}